

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

unsigned_long_long
anon_unknown.dwarf_e7629::ParseLong(ExpressionContext *ctx,SynBase *source,char *s,char *e,int base)

{
  char *pcVar1;
  uint local_54;
  unsigned_long_long prev;
  char *pcStack_40;
  int digit;
  char *p;
  unsigned_long_long res;
  int base_local;
  char *e_local;
  char *s_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  
  p = (char *)0x0;
  for (pcStack_40 = s; pcStack_40 < e; pcStack_40 = pcStack_40 + 1) {
    if ((*pcStack_40 < '0') || ('9' < *pcStack_40)) {
      local_54 = ((int)*pcStack_40 & 0xffffffdfU) - 0x37;
    }
    else {
      local_54 = (int)*pcStack_40 - 0x30;
    }
    if (((int)local_54 < 0) || (base <= (int)local_54)) {
      ReportAt(ctx,source,pcStack_40,"ERROR: digit %d is not allowed in base %d",(ulong)local_54,
               (ulong)(uint)base);
    }
    pcVar1 = (char *)((long)p * (long)base + (long)(int)local_54);
    if (pcVar1 < p) {
      StopAt(ctx,source,s,"ERROR: overflow in integer constant");
    }
    p = pcVar1;
  }
  return (unsigned_long_long)p;
}

Assistant:

unsigned long long ParseLong(ExpressionContext &ctx, SynBase *source, const char* s, const char* e, int base)
	{
		unsigned long long res = 0;

		for(const char *p = s; p < e; p++)
		{
			int digit = ((*p >= '0' && *p <= '9') ? *p - '0' : (*p & ~0x20) - 'A' + 10);

			if(digit < 0 || digit >= base)
				ReportAt(ctx, source, p, "ERROR: digit %d is not allowed in base %d", digit, base);

			unsigned long long prev = res;

			res = res * base + digit;

			if(res < prev)
				StopAt(ctx, source, s, "ERROR: overflow in integer constant");
		}

		return res;
	}